

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternGeneration.cpp
# Opt level: O2

Scalar * __thiscall
PatternGeneration::getRandomColor(Scalar *__return_storage_ptr__,PatternGeneration *this)

{
  uint uVar1;
  result_type rVar2;
  result_type rVar3;
  result_type rVar4;
  undefined1 local_2750 [8];
  random_device rd;
  mt19937 mt;
  
  std::random_device::random_device((random_device *)local_2750);
  uVar1 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *)((long)&rd.field_0 + 0x1380),(ulong)uVar1);
  rVar2 = std::uniform_int_distribution<int>::operator()
                    ((this->dist).
                     super___shared_ptr<std::uniform_int_distribution<int>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,(mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                              *)((long)&rd.field_0 + 0x1380));
  rVar3 = std::uniform_int_distribution<int>::operator()
                    ((this->dist).
                     super___shared_ptr<std::uniform_int_distribution<int>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,(mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                              *)((long)&rd.field_0 + 0x1380));
  rVar4 = std::uniform_int_distribution<int>::operator()
                    ((this->dist).
                     super___shared_ptr<std::uniform_int_distribution<int>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,(mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                              *)((long)&rd.field_0 + 0x1380));
  cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)__return_storage_ptr__);
  (__return_storage_ptr__->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0] =
       (double)(rVar2 % 0xff);
  (__return_storage_ptr__->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1] =
       (double)(rVar3 % 0xff);
  (__return_storage_ptr__->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2] =
       (double)(rVar4 % 0xff);
  (__return_storage_ptr__->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3] = 0.0;
  std::random_device::~random_device((random_device *)local_2750);
  return __return_storage_ptr__;
}

Assistant:

cv::Scalar PatternGeneration::getRandomColor()
{
    std::random_device rd;
    std::mt19937 mt(rd());

    return cv::Scalar( (*dist)(mt)%255, (*dist)(mt)%255, (*dist)(mt)%255);
}